

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O1

void __thiscall rw::World::addClump(World *this,Clump *clump)

{
  LLLink *pLVar1;
  LLLink *pLVar2;
  void *pvVar3;
  LLLink *pLVar4;
  
  clump->world = this;
  (clump->inWorld).next = (this->clumps).link.next;
  (clump->inWorld).prev = &(this->clumps).link;
  ((this->clumps).link.next)->prev = &clump->inWorld;
  (this->clumps).link.next = &clump->inWorld;
  pLVar4 = (clump->atomics).link.next;
  while (pLVar4 != &(clump->atomics).link) {
    pLVar2 = pLVar4 + -5;
    pLVar1 = pLVar4->next;
    pLVar4[2].next = (LLLink *)this;
    pLVar4 = pLVar1;
    if ((Frame *)pLVar2->next != (Frame *)0x0) {
      Frame::updateObjects((Frame *)pLVar2->next);
    }
  }
  pLVar4 = (clump->lights).link.next;
  while (pLVar4 != &(clump->lights).link) {
    pLVar2 = pLVar4->next;
    addLight(this,(Light *)&pLVar4[-6].prev);
    pLVar4 = pLVar2;
  }
  pLVar4 = (clump->cameras).link.next;
  while (pLVar4 != &(clump->cameras).link) {
    pLVar1 = pLVar4->next;
    pLVar4[1].next = (LLLink *)this;
    pLVar2 = pLVar4 + -0x22;
    pLVar4 = pLVar1;
    if ((Frame *)pLVar2->next != (Frame *)0x0) {
      Frame::updateObjects((Frame *)pLVar2->next);
    }
  }
  pvVar3 = (clump->object).parent;
  if (pvVar3 == (void *)0x0) {
    return;
  }
  Matrix::optimize((Matrix *)((long)pvVar3 + 0x30),(Tolerance *)0x0);
  Frame::updateObjects((Frame *)(clump->object).parent);
  return;
}

Assistant:

void
World::addClump(Clump *clump)
{
	assert(clump->world == nil);
	clump->world = this;
	this->clumps.add(&clump->inWorld);
	FORLIST(lnk, clump->atomics)
		this->addAtomic(Atomic::fromClump(lnk));
	FORLIST(lnk, clump->lights)
		this->addLight(Light::fromClump(lnk));
	FORLIST(lnk, clump->cameras)
		this->addCamera(Camera::fromClump(lnk));

	if(clump->getFrame()){
		clump->getFrame()->matrix.optimize();
		clump->getFrame()->updateObjects();
	}
}